

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O2

PList * p_hash_table_lookup_by_value(PHashTable *table,pconstpointer val,PCompareFunc func)

{
  pint pVar1;
  PList *list;
  PHashTableNode *pPVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (table == (PHashTable *)0x0) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    for (; (ulong)uVar3 < table->size; uVar3 = uVar3 + 1) {
      pPVar2 = (PHashTableNode *)(table->table + uVar3);
LAB_00110b47:
      while (pPVar2 = pPVar2->next, pPVar2 != (PHashTableNode *)0x0) {
        if (func == (PCompareFunc)0x0) goto LAB_00110b64;
        pVar1 = (*func)(pPVar2->value,val);
        if (pVar1 == 0) goto LAB_00110b69;
      }
    }
  }
  return list;
LAB_00110b64:
  if (pPVar2->value == val) {
LAB_00110b69:
    list = p_list_append(list,pPVar2->key);
  }
  goto LAB_00110b47;
}

Assistant:

P_LIB_API PList *
p_hash_table_lookup_by_value (const PHashTable *table, pconstpointer val, PCompareFunc func)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;
	pboolean	res;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next) {
			if (func == NULL)
				res = (node->value == val);
			else
				res = (func (node->value, val) == 0);

			if (res)
				ret = p_list_append (ret, node->key);
		}

	return ret;
}